

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

int infer_skip(bitstream *str,h264_slice *slice,h264_macroblock *mb)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  h264_macroblock *val;
  uint32_t ival;
  
  ival = 0x20;
  if (slice->slice_type == 1) {
    ival = 0x38;
  }
  if (slice->mbaff_frame_flag == 0) {
    val = slice->mbs + slice->curr_mb_addr;
    uVar1 = slice->field_pic_flag;
  }
  else {
    if ((slice->curr_mb_addr & 1) == 0) goto LAB_00109964;
    uVar1 = slice->mbs[slice->curr_mb_addr & 0xfffffffe].mb_type;
    if ((uVar1 == 0x38) || (uVar1 == 0x20)) {
      uVar1 = inferred_mb_field_decoding_flag(slice);
      iVar2 = vs_infer(str,&mb[-1].mb_field_decoding_flag,uVar1);
      if (iVar2 != 0) {
        return 1;
      }
    }
    uVar1 = mb[-1].mb_field_decoding_flag;
    val = mb;
  }
  iVar2 = vs_infer(str,&val->mb_field_decoding_flag,uVar1);
  if (iVar2 != 0) {
    return 1;
  }
LAB_00109964:
  iVar2 = vs_infer(str,&mb->mb_type,ival);
  iVar3 = 1;
  if ((((iVar2 == 0) && (iVar2 = vs_infers(str,&mb->mb_qp_delta,0), iVar2 == 0)) &&
      (iVar2 = vs_infer(str,&mb->transform_size_8x8_flag,0), iVar2 == 0)) &&
     (((iVar2 = vs_infer(str,&mb->coded_block_pattern,0), iVar2 == 0 &&
       (iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0), iVar2 == 0)) &&
      (iVar2 = infer_intra(str,mb,0), iVar2 == 0)))) {
    iVar3 = 1;
    iVar2 = infer_intra(str,mb,1);
    if (iVar2 == 0) {
      iVar3 = 0;
      memset(mb->coded_block_flag,0,0xcc);
      memset(mb->total_coeff,0,0xc0);
    }
  }
  return iVar3;
}

Assistant:

static int infer_skip(struct bitstream *str, struct h264_slice *slice, struct h264_macroblock *mb) {
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->mbaff_frame_flag) {
		if (slice->curr_mb_addr & 1) {
			if (h264_is_skip_mb_type(slice->mbs[slice->curr_mb_addr & ~1].mb_type)) {
				int val = inferred_mb_field_decoding_flag(slice);
				if (vs_infer(str, &mb[-1].mb_field_decoding_flag, val)) return 1;
			}
			if (vs_infer(str, &mb->mb_field_decoding_flag, mb[-1].mb_field_decoding_flag)) return 1;
		}
	} else {
		if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;

	}
	if (vs_infer(str, &mb->mb_type, skip_type)) return 1;
	if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
	if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
	if (vs_infer(str, &mb->coded_block_pattern, 0)) return 1;
	if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	if (infer_intra(str, mb, 0)) return 1;
	if (infer_intra(str, mb, 1)) return 1;
	int i;
	for (i = 0; i < 17; i++) {
		mb->coded_block_flag[0][i] = 0;
		mb->coded_block_flag[1][i] = 0;
		mb->coded_block_flag[2][i] = 0;
	}
	for (i = 0; i < 16; i++) {
		mb->total_coeff[0][i] = 0;
		mb->total_coeff[1][i] = 0;
		mb->total_coeff[2][i] = 0;
	}
	return 0;
}